

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5HashScanEntry(Fts5Hash *pHash,char **pzTerm,u8 **ppDoclist,int *pnDoclist)

{
  Fts5HashEntry *p_00;
  Fts5HashEntry *__s;
  size_t sVar1;
  int nTerm;
  char *zKey;
  Fts5HashEntry *p;
  int *pnDoclist_local;
  u8 **ppDoclist_local;
  char **pzTerm_local;
  Fts5Hash *pHash_local;
  
  p_00 = pHash->pScan;
  if (p_00 == (Fts5HashEntry *)0x0) {
    *pzTerm = (char *)0x0;
    *ppDoclist = (u8 *)0x0;
    *pnDoclist = 0;
  }
  else {
    __s = p_00 + 1;
    sVar1 = strlen((char *)__s);
    fts5HashAddPoslistSize(pHash,p_00,(Fts5HashEntry *)0x0);
    *pzTerm = (char *)__s;
    *ppDoclist = (u8 *)((long)&__s->pHashNext + (long)((int)sVar1 + 1));
    *pnDoclist = p_00->nData - ((int)sVar1 + 0x31);
  }
  return;
}

Assistant:

static void sqlite3Fts5HashScanEntry(
  Fts5Hash *pHash,
  const char **pzTerm,            /* OUT: term (nul-terminated) */
  const u8 **ppDoclist,           /* OUT: pointer to doclist */
  int *pnDoclist                  /* OUT: size of doclist in bytes */
){
  Fts5HashEntry *p;
  if( (p = pHash->pScan) ){
    char *zKey = fts5EntryKey(p);
    int nTerm = (int)strlen(zKey);
    fts5HashAddPoslistSize(pHash, p, 0);
    *pzTerm = zKey;
    *ppDoclist = (const u8*)&zKey[nTerm+1];
    *pnDoclist = p->nData - (sizeof(Fts5HashEntry) + nTerm + 1);
  }else{
    *pzTerm = 0;
    *ppDoclist = 0;
    *pnDoclist = 0;
  }
}